

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O1

bool chatter::platform::SocketBind(Socket socket,HostAddress *address)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  sockaddr_in sin;
  sockaddr local_28;
  
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_28.sa_family = 2;
  local_28.sa_data[0] = '\0';
  local_28.sa_data[1] = '\0';
  local_28.sa_data[2] = '\0';
  local_28.sa_data[3] = '\0';
  local_28.sa_data[4] = '\0';
  local_28.sa_data[5] = '\0';
  uVar1 = HostAddress::port(address);
  local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  uVar2 = HostAddress::address(address);
  local_28.sa_data._2_4_ = uVar2;
  iVar3 = bind(socket,&local_28,0x10);
  return iVar3 == 0;
}

Assistant:

bool SocketBind(Socket socket, const HostAddress& address)
{
    struct sockaddr_in sin;
    int rc;

    memset(&sin, 0, sizeof(sin));

    sin.sin_family = AF_INET;
    sin.sin_port = HostToNet16(address.port());
    sin.sin_addr.s_addr = address.address();

    rc = bind(socket, (struct sockaddr *)&sin, sizeof(sin));
    return rc == 0 ? true : false;
}